

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O1

void __thiscall
libguarded::detail::
deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
::operator()(deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
             *this,pointer p)

{
  BentoAbstract *pBVar1;
  _Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false> _Var2;
  
  if (p != (pointer)0x0) {
    pBVar1 = (p->data).slotMethod._M_t.
             super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
             .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
    if (pBVar1 != (BentoAbstract *)0x0) {
      (**(code **)(*(long *)pBVar1 + 8))();
    }
    (p->data).slotMethod._M_t.
    super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
    .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
         (BentoAbstract *)0x0;
    _Var2._M_head_impl =
         (p->data).signalMethod._M_t.
         super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
         .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (BentoAbstract *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
    (p->data).signalMethod._M_t.
    super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
    .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
         (BentoAbstract *)0x0;
    operator_delete(p,0x38);
    return;
  }
  return;
}

Assistant:

void operator()(pointer p) {
      if (p != nullptr) {
         allocator_traits::destroy(m_alloc, p);
         allocator_traits::deallocate(m_alloc, p, 1);
      }
   }